

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O0

void luaF_close(lua_State *L,StkId level)

{
  uint uVar1;
  GCObject *pGVar2;
  bool bVar3;
  TValue *io1;
  UpVal *uv;
  StkId level_local;
  lua_State *L_local;
  
  while( true ) {
    bVar3 = false;
    if (L->openupval != (UpVal *)0x0) {
      io1 = (TValue *)L->openupval;
      bVar3 = level <= ((UpVal *)io1)->v;
    }
    if (!bVar3) break;
    L->openupval = (UpVal *)io1[1].value_;
    if (*(long *)&io1->tt_ == 0) {
      luaM_realloc_(L,io1,0x20,0);
    }
    else {
      io1[1].value_ = *(Value *)(io1->value_).gc;
      *(Value *)&io1[1].tt_ = ((Value *)(io1->value_).gc)[1];
      (io1->value_).gc = (GCObject *)(io1 + 1);
      pGVar2 = (io1->value_).gc;
      uVar1._0_1_ = pGVar2->tt;
      uVar1._1_1_ = pGVar2->marked;
      uVar1._2_2_ = *(undefined2 *)&pGVar2->field_0xa;
      if (((uVar1 & 0x40) != 0) && ((io1->value_).gc == (GCObject *)(io1 + 1))) {
        luaC_upvalbarrier_(L,(UpVal *)io1);
      }
    }
  }
  return;
}

Assistant:

void luaF_close(lua_State *L, StkId level) {
    UpVal *uv;
    while (L->openupval != NULL && (uv = L->openupval)->v >= level) {
        lua_assert(upisopen(uv));
        L->openupval = uv->u.open.next;  /* remove from 'open' list */
        if (uv->refcount == 0)  /* no references? */
            luaM_free(L, uv);  /* free upvalue */
        else {
            setobj(L, &uv->u.value, uv->v);  /* move value to upvalue slot */
            uv->v = &uv->u.value;  /* now current value lives here */
            luaC_upvalbarrier(L, uv);
        }
    }
}